

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

log_map log_map_create(size_t size)

{
  log_map_bucket_conflict plVar1;
  log_map_bucket_conflict *pplVar2;
  size_t in_RDI;
  log_map_bucket_conflict bucket;
  log_map map;
  size_t iterator;
  ulong local_18;
  size_t local_10;
  log_map local_8;
  
  local_10 = log_valid_size(in_RDI);
  if (local_10 < 0x100) {
    local_10 = 0x100;
  }
  else if (0x10000 < local_10) {
    local_10 = 0x10000;
  }
  local_8 = (log_map)malloc(0x38);
  if (local_8 == (log_map)0x0) {
    local_8 = (log_map)0x0;
  }
  else {
    plVar1 = (log_map_bucket_conflict)malloc(local_10 * 0x18);
    (local_8->table).data = plVar1;
    if ((local_8->table).data == (log_map_bucket_conflict)0x0) {
      free(local_8);
      local_8 = (log_map)0x0;
    }
    else {
      (local_8->table).count = 0;
      (local_8->table).size = local_10;
      for (local_18 = 0; local_18 < (local_8->table).size; local_18 = local_18 + 1) {
        plVar1 = (local_8->table).data + local_18;
        plVar1->key = (char *)0x0;
        plVar1->value = (void *)0x0;
        plVar1->next = (log_map_bucket)0x0;
      }
      pplVar2 = (log_map_bucket_conflict *)malloc(local_10 << 3);
      (local_8->block).data = pplVar2;
      if ((local_8->block).data == (log_map_bucket_conflict *)0x0) {
        free((local_8->table).data);
        free(local_8);
        local_8 = (log_map)0x0;
      }
      else {
        (local_8->block).count = 0;
        (local_8->block).size = local_10;
        (local_8->block).position = 0x100;
        for (local_18 = 0; local_18 < (local_8->block).size; local_18 = local_18 + 1) {
          (local_8->block).data[local_18] = (log_map_bucket_conflict)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

log_map log_map_create(size_t size)
{
	size_t iterator;

	log_map map = NULL;

	size = log_valid_size(size);

	if (size < LOG_MAP_MIN_SIZE)
	{
		size = LOG_MAP_MIN_SIZE;
	}
	else if (size > LOG_MAP_MAX_SIZE)
	{
		size = LOG_MAP_MAX_SIZE;
	}

	map = malloc(sizeof(struct log_map_type));

	if (map == NULL)
	{
		return NULL;
	}

	map->table.data = malloc(sizeof(struct log_map_bucket_type) * size);

	if (map->table.data == NULL)
	{
		free(map);

		return NULL;
	}

	map->table.count = 0;
	map->table.size = size;

	for (iterator = 0; iterator < map->table.size; ++iterator)
	{
		log_map_bucket bucket = &map->table.data[iterator];

		bucket->key = NULL;
		bucket->value = NULL;
		bucket->next = NULL;
	}

	map->block.data = malloc(sizeof(log_map_bucket) * size);

	if (map->block.data == NULL)
	{
		free(map->table.data);

		free(map);

		return NULL;
	}

	map->block.count = 0;
	map->block.size = size;
	map->block.position = LOG_MAP_BUCKET_SIZE;

	for (iterator = 0; iterator < map->block.size; ++iterator)
	{
		map->block.data[iterator] = NULL;
	}

	return map;
}